

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

void __thiscall cmFileCopier::~cmFileCopier(cmFileCopier *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_cmFileCopier = (_func_int **)&PTR__cmFileCopier_00633b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Files);
  pcVar2 = (this->FilesFromDir)._M_dataplus._M_p;
  paVar1 = &(this->FilesFromDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->Destination)._M_dataplus._M_p;
  paVar1 = &(this->Destination).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::~vector
            (&this->MatchRules);
  cmFileTimeCache::~cmFileTimeCache(&this->FileTimes);
  return;
}

Assistant:

cmFileCopier::~cmFileCopier() = default;